

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha256DByteScript_Test::HashUtil_Sha256DByteScript_Test
          (HashUtil_Sha256DByteScript_Test *this)

{
  HashUtil_Sha256DByteScript_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HashUtil_Sha256DByteScript_Test_0087fed8;
  return;
}

Assistant:

TEST(HashUtil, Sha256DByteScript) {
  Script target(
      "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac");
  ByteData256 byte_data = HashUtil::Sha256D(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "f90db0faee6addeb5cb4f66fa11590d5a21475fcbad58f3e847f0d27a2d18668");
}